

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O2

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ContIntFromDescriptor
          (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
           *this,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  Scalar *pSVar2;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
  ContIntFromDescriptor
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             off_L,L);
  SVar1 = (this->Rx).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          .super_ChConstraint.l_i;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                      (ulong)(off_L + 3));
  *pSVar2 = SVar1;
  SVar1 = (this->Ru).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          .super_ChConstraint.l_i;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                      (ulong)(off_L + 4));
  *pSVar2 = SVar1;
  SVar1 = (this->Rv).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          .super_ChConstraint.l_i;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                      (ulong)(off_L + 5));
  *pSVar2 = SVar1;
  return;
}

Assistant:

virtual void ContIntFromDescriptor(const unsigned int off_L, ChVectorDynamic<>& L) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ContIntFromDescriptor(off_L, L);

        L(off_L + 3) = Rx.Get_l_i();
        L(off_L + 4) = Ru.Get_l_i();
        L(off_L + 5) = Rv.Get_l_i();
    }